

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_threads.c
# Opt level: O3

void * curl_thread_create_thunk(void *arg)

{
  code *pcVar1;
  undefined8 uVar2;
  
  pcVar1 = *arg;
  uVar2 = *(undefined8 *)((long)arg + 8);
  (*Curl_cfree)(arg);
  (*pcVar1)(uVar2);
  return (void *)0x0;
}

Assistant:

static void *curl_thread_create_thunk(void *arg)
{
  struct curl_actual_call * ac = arg;
  unsigned int (*func)(void *) = ac->func;
  void *real_arg = ac->arg;

  free(ac);

  (*func)(real_arg);

  return 0;
}